

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

MarketDataRequest * __thiscall
Application::queryMarketDataRequest43(MarketDataRequest *__return_storage_ptr__,Application *this)

{
  ostream *poVar1;
  allocator<char> local_2d9;
  STRING local_2d8;
  NoMDEntryTypes marketDataEntryGroup;
  NoRelatedSym symbolGroup;
  Symbol symbol;
  MDEntryType mdEntryType;
  MarketDepth marketDepth;
  SubscriptionRequestType subType;
  MDReqID mdReqID;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&marketDataEntryGroup,"MARKETDATAID",(allocator<char> *)&symbolGroup);
  FIX::MDReqID::MDReqID(&mdReqID,(STRING *)&marketDataEntryGroup);
  std::__cxx11::string::~string((string *)&marketDataEntryGroup);
  FIX::SubscriptionRequestType::SubscriptionRequestType(&subType,"0012568912340321511Application");
  FIX::MarketDepth::MarketDepth(&marketDepth,0);
  FIX43::MarketDataRequest::NoMDEntryTypes::NoMDEntryTypes(&marketDataEntryGroup);
  FIX::MDEntryType::MDEntryType(&mdEntryType,"012568912340321511Application");
  FIX43::MarketDataRequest::NoMDEntryTypes::set(&marketDataEntryGroup,&mdEntryType);
  FIX43::MarketDataRequest::NoRelatedSym::NoRelatedSym(&symbolGroup);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"LNUX",&local_2d9);
  FIX::Symbol::Symbol(&symbol,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  FIX43::MarketDataRequest::NoRelatedSym::set(&symbolGroup,&symbol);
  FIX43::MarketDataRequest::MarketDataRequest(__return_storage_ptr__,&mdReqID,&subType,&marketDepth)
  ;
  FIX::Message::addGroup((Message *)__return_storage_ptr__,&marketDataEntryGroup.super_Group);
  FIX::Message::addGroup((Message *)__return_storage_ptr__,&symbolGroup.super_Group);
  queryHeader(this,(Header *)&(__return_storage_ptr__->super_Message).field_0x70);
  FIX::Message::toXML_abi_cxx11_();
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_2d8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_2d8);
  FIX::Message::toString_abi_cxx11_((int)&local_2d8,(int)__return_storage_ptr__,8);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_2d8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_2d8);
  FIX::FieldBase::~FieldBase((FieldBase *)&symbol);
  FIX::FieldMap::~FieldMap((FieldMap *)&symbolGroup);
  FIX::FieldBase::~FieldBase((FieldBase *)&mdEntryType);
  FIX::FieldMap::~FieldMap((FieldMap *)&marketDataEntryGroup);
  FIX::FieldBase::~FieldBase((FieldBase *)&marketDepth);
  FIX::FieldBase::~FieldBase((FieldBase *)&subType);
  FIX::FieldBase::~FieldBase((FieldBase *)&mdReqID);
  return __return_storage_ptr__;
}

Assistant:

FIX43::MarketDataRequest Application::queryMarketDataRequest43() {
  FIX::MDReqID mdReqID("MARKETDATAID");
  FIX::SubscriptionRequestType subType(FIX::SubscriptionRequestType_SNAPSHOT);
  FIX::MarketDepth marketDepth(0);

  FIX43::MarketDataRequest::NoMDEntryTypes marketDataEntryGroup;
  FIX::MDEntryType mdEntryType(FIX::MDEntryType_BID);
  marketDataEntryGroup.set(mdEntryType);

  FIX43::MarketDataRequest::NoRelatedSym symbolGroup;
  FIX::Symbol symbol("LNUX");
  symbolGroup.set(symbol);

  FIX43::MarketDataRequest message(mdReqID, subType, marketDepth);
  message.addGroup(marketDataEntryGroup);
  message.addGroup(symbolGroup);

  queryHeader(message.getHeader());

  std::cout << message.toXML() << std::endl;
  std::cout << message.toString() << std::endl;

  return message;
}